

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O3

int __thiscall ZipArchive::close(ZipArchive *this,int __fd)

{
  uchar *__ptr;
  FILE *__stream;
  undefined2 uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  uint uVar6;
  char cVar7;
  undefined2 uVar8;
  uint local_78 [6];
  uint64_t local_60;
  uint64_t local_58;
  size_t local_50;
  ulong local_48;
  long local_40;
  size_t endCD;
  
  uVar3 = ftell((FILE *)(this->f).fp_);
  __ptr = (this->entries)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  fwrite(__ptr,1,(long)this->entryPtr - (long)__ptr,(FILE *)(this->f).fp_);
  lVar4 = ftell((FILE *)(this->f).fp_);
  local_40 = ftell((FILE *)(this->f).fp_);
  cVar7 = this->force64;
  if ((bool)cVar7 == false) {
    if (0xfffe < this->entryCount) {
      cVar7 = '\x01';
    }
    if (0xfffffffe < uVar3) {
      cVar7 = '\x01';
    }
  }
  if (cVar7 != '\0') {
    local_78[0] = 0x6064b50;
    local_78[1] = 0x2c;
    local_78[2] = 0;
    local_78[3] = 0x2d031e;
    local_78[4] = 0;
    local_78[5] = 0;
    local_60 = this->entryCount;
    local_58 = local_60;
    local_50 = lVar4 - uVar3;
    local_48 = uVar3;
    fwrite(local_78,1,0x38,(FILE *)(this->f).fp_);
    local_78[0] = 0x7064b50;
    fwrite(local_78,1,4,(FILE *)(this->f).fp_);
    local_78[0] = 0;
    fwrite(local_78,1,4,(FILE *)(this->f).fp_);
    fwrite(&local_40,1,8,(FILE *)(this->f).fp_);
    local_78[0] = 1;
    fwrite(local_78,1,4,(FILE *)(this->f).fp_);
  }
  local_78[0] = 0x6054b50;
  endCD = lVar4 - uVar3;
  fwrite(local_78,1,4,(FILE *)(this->f).fp_);
  local_78[0] = local_78[0] & 0xffff0000;
  fwrite(local_78,1,2,(FILE *)(this->f).fp_);
  local_78[0] = local_78[0] & 0xffff0000;
  fwrite(local_78,1,2,(FILE *)(this->f).fp_);
  uVar8 = 0xffff;
  uVar1 = 0xffff;
  if (cVar7 == '\0') {
    uVar1 = (undefined2)this->entryCount;
  }
  local_78[0]._0_2_ = uVar1;
  fwrite(local_78,1,2,(FILE *)(this->f).fp_);
  uVar6 = 0xffffffff;
  if (cVar7 == '\0') {
    uVar8 = (undefined2)this->entryCount;
    uVar6 = (uint)uVar3;
  }
  local_78[0] = CONCAT22(local_78[0]._2_2_,uVar8);
  fwrite(local_78,1,2,(FILE *)(this->f).fp_);
  local_78[0] = (uint)endCD;
  fwrite(local_78,1,4,(FILE *)(this->f).fp_);
  local_78[0] = uVar6;
  fwrite(local_78,1,4,(FILE *)(this->f).fp_);
  local_78[0] = local_78[0] & 0xffff0000;
  sVar5 = fwrite(local_78,1,2,(FILE *)(this->f).fp_);
  iVar2 = (int)sVar5;
  __stream = (FILE *)(this->f).fp_;
  if (__stream != (FILE *)0x0) {
    iVar2 = fclose(__stream);
  }
  (this->f).fp_ = (FILE *)0x0;
  return iVar2;
}

Assistant:

void ZipArchive::close()
{
    auto startCD = f.tell(); // tell_x(fp);

    write(entries.get(), entryPtr - entries.get());
    auto sizeCD = f.tell() - startCD;

    auto endCD = f.tell();

    bool end64 = force64;
    if (!end64) {
        if (entryCount > 0xfffe || startCD > 0xfffffffeL)
            end64 = true;
    }

    if (end64) {
        write<EndOfCentralDir64>({0x06064b50, 44, 0x031e, 45, 0, 0, entryCount,
                                  entryCount, (int64_t)sizeCD,
                                  (int64_t)startCD});
        // Locator
        write<uint32_t>(0x07064b50);
        write<uint32_t>(0);
        write<uint64_t>(endCD);
        write<uint32_t>(1);
    }
    write<uint32_t>(0x06054b50);
    write<uint16_t>(0);
    write<uint16_t>(0);
    write<uint16_t>(end64 ? 0xffff : entryCount);
    write<uint16_t>(end64 ? 0xffff : entryCount);
    write<uint32_t>(sizeCD);
    write<uint32_t>(end64 ? 0xffffffff : startCD);
    write<uint16_t>(0);

    f.close();
}